

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

char * __thiscall Fl_Input_::expand(Fl_Input_ *this,char *p,char *buf)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *buf_00;
  double extraout_XMM0_Qa;
  int local_40;
  int local_3c;
  
  if (((this->super_Fl_Widget).type_ & 7) == 5) {
    lVar10 = 0;
    for (; (buf_00 = (byte *)(buf + lVar10), pbVar9 = (byte *)p, lVar10 < 0x3fc &&
           (p < this->value_ + this->size_)); p = (char *)((byte *)p + 1)) {
      iVar4 = fl_utf8len(*p);
      if (0 < iVar4) {
        l_secret = fl_utf8encode(0x2a,(char *)buf_00);
        lVar10 = lVar10 + l_secret;
      }
    }
  }
  else {
    lVar10 = 0;
    local_3c = 0;
    local_40 = 0;
    pbVar7 = (byte *)p;
    pbVar11 = (byte *)buf;
    while (pbVar2 = (byte *)(buf + lVar10), pbVar9 = (byte *)p, buf_00 = pbVar2, lVar10 < 0x3fc) {
      pbVar8 = pbVar7;
      pbVar12 = pbVar11;
      if ((((this->super_Fl_Widget).type_ & 0x10) != 0) &&
         ((this->value_ + this->size_ <= p || (iVar4 = isspace((uint)(byte)*p), iVar4 != 0)))) {
        iVar4 = (this->super_Fl_Widget).w_;
        iVar5 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                  (fl_graphics_driver,pbVar11,(ulong)(uint)((int)pbVar2 - (int)pbVar11));
        local_3c = local_3c + (int)extraout_XMM0_Qa;
        pbVar8 = (byte *)p;
        pbVar12 = pbVar2;
        if (pbVar7 + 1 < p) {
          if ((local_40 != 0) &&
             (pbVar9 = pbVar7, buf_00 = pbVar11, (iVar4 - iVar5) + -2 < local_3c)) break;
          local_40 = local_40 + 1;
        }
      }
      pbVar9 = (byte *)p;
      buf_00 = pbVar2;
      if (this->value_ + this->size_ <= p) break;
      pbVar1 = (byte *)p + 1;
      bVar3 = *p;
      pbVar7 = pbVar8;
      pbVar11 = pbVar12;
      if (bVar3 < 0x20 || bVar3 == 0x7f) {
        if (bVar3 == 9) {
          if (((this->super_Fl_Widget).type_ & 7) != 4) goto LAB_00184d2b;
          iVar4 = fl_utf_nb_char((uchar *)buf,(int)lVar10);
          uVar6 = (long)iVar4 % 8 & 0xffffffff;
          for (; (p = (char *)pbVar1, (int)uVar6 < 8 && (lVar10 < 0x3fc)); lVar10 = lVar10 + 1) {
            buf[lVar10] = ' ';
            uVar6 = (ulong)((int)uVar6 + 1);
          }
        }
        else {
          if ((bVar3 == 10) && (((this->super_Fl_Widget).type_ & 7) == 4)) break;
LAB_00184d2b:
          *pbVar2 = 0x5e;
          lVar10 = lVar10 + 2;
          pbVar2[1] = bVar3 ^ 0x40;
          p = (char *)pbVar1;
        }
      }
      else {
        lVar10 = lVar10 + 1;
        *pbVar2 = bVar3;
        p = (char *)pbVar1;
      }
    }
  }
  *buf_00 = 0;
  return (char *)pbVar9;
}

Assistant:

const char* Fl_Input_::expand(const char* p, char* buf) const {
  char* o = buf;
  char* e = buf+(MAXBUF-4);
  const char* lastspace = p;
  char* lastspace_out = o;
  int width_to_lastspace = 0;
  int word_count = 0;
  int word_wrap;
//  const char *pe = p + strlen(p);

  if (input_type()==FL_SECRET_INPUT) {
    while (o<e && p < value_+size_) {
      if (fl_utf8len((char)p[0]) >= 1) {
	l_secret = fl_utf8encode(secret_char, o);
	o += l_secret;
      }
      p++;
    }

  } else while (o<e) {
    if (wrap() && (p >= value_+size_ || isspace(*p & 255))) {
      word_wrap = w() - Fl::box_dw(box()) - 2;
      width_to_lastspace += (int)fl_width(lastspace_out, (int) (o-lastspace_out));
      if (p > lastspace+1) {
	if (word_count && width_to_lastspace > word_wrap) {
	  p = lastspace; o = lastspace_out; break;
	}
	word_count++;
      }
      lastspace = p;
      lastspace_out = o;
    }

    if (p >= value_+size_) break;
    int c = *p++ & 255;
    if (c < ' ' || c == 127) {
      if (c=='\n' && input_type()==FL_MULTILINE_INPUT) {p--; break;}
      if (c == '\t' && input_type()==FL_MULTILINE_INPUT) {
        for (c = fl_utf_nb_char((uchar*)buf, (int) (o-buf))%8; c<8 && o<e; c++) {
          *o++ = ' ';
        }
      } else {
	*o++ = '^';
	*o++ = c ^ 0x40;
      }
    } else {
      *o++ = c;
    }
  }
  *o = 0;
  return p;
}